

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::anon_unknown_1::AttachmentTextureLevelCase::test
          (AttachmentTextureLevelCase *this)

{
  GLuint local_1c;
  GLenum local_18;
  GLuint textureID;
  int mipmapLevel;
  GLuint framebufferID;
  AttachmentTextureLevelCase *this_local;
  
  textureID = 0;
  _mipmapLevel = this;
  glu::CallLogWrapper::glGenFramebuffers(&(this->super_ApiCase).super_CallLogWrapper,1,&textureID);
  glu::CallLogWrapper::glBindFramebuffer
            (&(this->super_ApiCase).super_CallLogWrapper,0x8d40,textureID);
  ApiCase::expectError(&this->super_ApiCase,0);
  for (local_18 = 0; (int)local_18 < 7; local_18 = local_18 + 1) {
    local_1c = 0;
    glu::CallLogWrapper::glGenTextures(&(this->super_ApiCase).super_CallLogWrapper,1,&local_1c);
    glu::CallLogWrapper::glBindTexture(&(this->super_ApiCase).super_CallLogWrapper,0xde1,local_1c);
    glu::CallLogWrapper::glTexStorage2D
              (&(this->super_ApiCase).super_CallLogWrapper,0xde1,7,0x8051,0x80,0x80);
    ApiCase::expectError(&this->super_ApiCase,0);
    glu::CallLogWrapper::glFramebufferTexture2D
              (&(this->super_ApiCase).super_CallLogWrapper,0x8d40,0x8ce0,0xde1,local_1c,local_18);
    ApiCase::expectError(&this->super_ApiCase,0);
    checkColorAttachmentParam
              ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
               &(this->super_ApiCase).super_CallLogWrapper,0x8d40,0x8cd2,local_18);
    glu::CallLogWrapper::glFramebufferTexture2D
              (&(this->super_ApiCase).super_CallLogWrapper,0x8d40,0x8ce0,0xde1,0,0);
    glu::CallLogWrapper::glDeleteTextures(&(this->super_ApiCase).super_CallLogWrapper,1,&local_1c);
  }
  glu::CallLogWrapper::glDeleteFramebuffers
            (&(this->super_ApiCase).super_CallLogWrapper,1,&textureID);
  ApiCase::expectError(&this->super_ApiCase,0);
  return;
}

Assistant:

void test (void)
	{
		GLuint framebufferID = 0;
		glGenFramebuffers(1, &framebufferID);
		glBindFramebuffer(GL_FRAMEBUFFER, framebufferID);
		expectError(GL_NO_ERROR);

		for (int mipmapLevel = 0; mipmapLevel < 7; ++mipmapLevel)
		{
			GLuint textureID = 0;
			glGenTextures(1, &textureID);
			glBindTexture(GL_TEXTURE_2D, textureID);
			glTexStorage2D(GL_TEXTURE_2D, 7, GL_RGB8, 128, 128);
			expectError(GL_NO_ERROR);

			glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, textureID, mipmapLevel);
			expectError(GL_NO_ERROR);

			checkColorAttachmentParam(m_testCtx, *this, GL_FRAMEBUFFER, GL_FRAMEBUFFER_ATTACHMENT_TEXTURE_LEVEL, mipmapLevel);

			glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, 0, 0);
			glDeleteTextures(1, &textureID);
		}

		glDeleteFramebuffers(1, &framebufferID);
		expectError(GL_NO_ERROR);
	}